

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

StringList * __thiscall
Rml::DataViewFor::GetVariableNameList_abi_cxx11_
          (StringList *__return_storage_ptr__,DataViewFor *this)

{
  code *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar2;
  const_reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  DataViewFor *this_local;
  
  local_18 = (undefined1  [8])this;
  this_local = (DataViewFor *)__return_storage_ptr__;
  bVar2 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::empty
                    (&this->container_address);
  if ((bVar2) &&
     (bVar2 = Assert("RMLUI_ASSERT(!container_address.empty())",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                     ,0x23a), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_50 = &local_48;
  pvVar3 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::front
                     (&this->container_address);
  ::std::__cxx11::string::string((string *)&local_48,(string *)pvVar3);
  local_28 = &local_48;
  local_20 = 1;
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::allocator(local_5d);
  __l._M_len = local_20;
  __l._M_array = local_28;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__return_storage_ptr__,__l,local_5d);
  ::std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~allocator(local_5d);
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  do {
    local_90 = local_90 + -1;
    ::std::__cxx11::string::~string((string *)local_90);
  } while (local_90 != &local_48);
  return __return_storage_ptr__;
}

Assistant:

StringList DataViewFor::GetVariableNameList() const
{
	RMLUI_ASSERT(!container_address.empty());
	return StringList{container_address.front().name};
}